

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

char __thiscall FileLexer::supply(FileLexer *this)

{
  int iVar1;
  int_type data;
  FileLexer *this_local;
  
  if ((this->done & 1U) == 0) {
    (this->super_Lexer).position = (this->super_Lexer).position + 1;
    iVar1 = std::istream::get();
    if (iVar1 == -1) {
      this->done = true;
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = (char)iVar1;
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

auto FileLexer::supply() -> char {
    if (done)
        return '\0';

    position++;
    auto data = stream.get();
    if (data == -1) {
        done = true;
        return '\0';
    }

    return data;
}